

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

PgHdr1 * pcache1FetchStage2(PCache1 *pCache,uint iKey,int createFlag)

{
  uint *puVar1;
  int iVar2;
  PGroup *pPVar3;
  PCache1 *pPVar4;
  PgHdr1 *pPVar5;
  PgHdr1 *pPVar6;
  PgHdr1 **ppPVar7;
  int iVar8;
  void *pvVar9;
  u64 uVar10;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  PgHdr1 **ppPVar15;
  u64 n;
  PgHdr1 *pPVar16;
  
  pPVar3 = pCache->pGroup;
  if (createFlag == 1) {
    uVar14 = pCache->nPage - pCache->nRecyclable;
    if (pPVar3->mxPinned <= uVar14) {
      return (PgHdr1 *)0x0;
    }
    if (pCache->n90pct <= uVar14) {
      return (PgHdr1 *)0x0;
    }
    if ((pcache1_g.nSlot == 0) || (pcache1_g.szSlot < pCache->szExtra + pCache->szPage)) {
      piVar11 = &mem0.nearlyFull;
    }
    else {
      piVar11 = &pcache1_g.bUnderPressure;
    }
    if (*piVar11 != 0 && pCache->nRecyclable < uVar14) {
      return (PgHdr1 *)0x0;
    }
  }
  if (pCache->nHash <= pCache->nPage) {
    pcache1ResizeHash(pCache);
  }
  if ((pCache->bPurgeable != 0) && (pPVar16 = (pPVar3->lru).pLruPrev, pPVar16->isAnchor == '\0')) {
    if (pCache->nPage + 1 < pCache->nMax) {
      if ((pcache1_g.nSlot == 0) || (pcache1_g.szSlot < pCache->szExtra + pCache->szPage)) {
        piVar11 = &mem0.nearlyFull;
      }
      else {
        piVar11 = &pcache1_g.bUnderPressure;
      }
      if (*piVar11 == 0) goto LAB_00257d2a;
    }
    pPVar4 = pPVar16->pCache;
    ppPVar7 = pPVar4->apHash + (ulong)pPVar16->iKey % (ulong)pPVar4->nHash;
    do {
      ppPVar15 = ppPVar7;
      pPVar5 = *ppPVar15;
      ppPVar7 = &pPVar5->pNext;
    } while (pPVar5 != pPVar16);
    *ppPVar15 = *ppPVar7;
    pPVar4->nPage = pPVar4->nPage - 1;
    pPVar4 = pPVar16->pCache;
    pPVar5 = pPVar16->pLruNext;
    pPVar6 = pPVar16->pLruPrev;
    pPVar6->pLruNext = pPVar5;
    pPVar5->pLruPrev = pPVar6;
    pPVar16->pLruNext = (PgHdr1 *)0x0;
    pPVar16->pLruPrev = (PgHdr1 *)0x0;
    pPVar16->isPinned = '\x01';
    pPVar4->nRecyclable = pPVar4->nRecyclable - 1;
    if (pPVar4->szAlloc == pCache->szAlloc) {
      pPVar3->nCurrentPage = pPVar3->nCurrentPage + (pCache->bPurgeable - pPVar4->bPurgeable);
      goto LAB_00257df9;
    }
    pcache1FreePage(pPVar16);
  }
LAB_00257d2a:
  pPVar16 = pCache->pFree;
  if (pPVar16 == (PgHdr1 *)0x0) {
    if (((pCache->nPage == 0) && (pcache1_g.nInitPage != 0)) && (2 < pCache->nMax)) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      if (pcache1_g.nInitPage < 1) {
        uVar10 = (long)pcache1_g.nInitPage * -0x400;
        lVar13 = (long)pCache->szAlloc;
      }
      else {
        lVar13 = (long)pCache->szAlloc;
        uVar10 = (ulong)(uint)pcache1_g.nInitPage * lVar13;
      }
      n = (ulong)pCache->nMax * lVar13;
      if ((long)uVar10 < (long)n) {
        n = uVar10;
      }
      pvVar9 = sqlite3Malloc(n);
      pCache->pBulk = pvVar9;
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pvVar9 == (void *)0x0) {
        pPVar16 = pCache->pFree;
        if (pPVar16 == (PgHdr1 *)0x0) goto LAB_00257d53;
      }
      else {
        iVar8 = (*sqlite3Config.m.xSize)(pvVar9);
        iVar2 = pCache->szAlloc;
        uVar12 = (long)iVar8 / (long)iVar2 & 0xffffffff;
        lVar13 = (long)pCache->szPage;
        pPVar16 = pCache->pFree;
        do {
          *(void **)((long)pvVar9 + lVar13) = pvVar9;
          *(long *)((long)pvVar9 + lVar13 + 8) = (long)pvVar9 + lVar13 + 0x38;
          *(undefined2 *)((long)pvVar9 + lVar13 + 0x15) = 1;
          *(PgHdr1 **)((long)pvVar9 + lVar13 + 0x18) = pPVar16;
          pPVar16 = (PgHdr1 *)((long)pvVar9 + lVar13);
          pvVar9 = (void *)((long)pvVar9 + (long)iVar2);
          uVar14 = (int)uVar12 - 1;
          uVar12 = (ulong)uVar14;
        } while (uVar14 != 0);
        pPVar16 = (PgHdr1 *)((long)pvVar9 + (lVar13 - iVar2));
      }
      goto LAB_00257d33;
    }
LAB_00257d53:
    if (createFlag == 1) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      pvVar9 = pcache1Alloc(pCache->szAlloc);
      pPVar16 = (PgHdr1 *)((long)pCache->szPage + (long)pvVar9);
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
    }
    else {
      pvVar9 = pcache1Alloc(pCache->szAlloc);
      pPVar16 = (PgHdr1 *)((long)pCache->szPage + (long)pvVar9);
    }
    if (pvVar9 == (void *)0x0) {
      return (PgHdr1 *)0x0;
    }
    (pPVar16->page).pBuf = pvVar9;
    (pPVar16->page).pExtra = pPVar16 + 1;
    pPVar16->isBulkLocal = '\0';
    pPVar16->isAnchor = '\0';
  }
  else {
LAB_00257d33:
    pCache->pFree = pPVar16->pNext;
    pPVar16->pNext = (PgHdr1 *)0x0;
  }
  if (pCache->bPurgeable != 0) {
    puVar1 = &pCache->pGroup->nCurrentPage;
    *puVar1 = *puVar1 + 1;
  }
LAB_00257df9:
  uVar12 = (ulong)iKey % (ulong)pCache->nHash;
  pCache->nPage = pCache->nPage + 1;
  pPVar16->iKey = iKey;
  pPVar16->pNext = pCache->apHash[uVar12];
  pPVar16->pCache = pCache;
  pPVar16->pLruNext = (PgHdr1 *)0x0;
  pPVar16->pLruPrev = (PgHdr1 *)0x0;
  pPVar16->isPinned = '\x01';
  *(undefined8 *)(pPVar16->page).pExtra = 0;
  pCache->apHash[uVar12] = pPVar16;
  if (pCache->iMaxKey < iKey) {
    pCache->iMaxKey = iKey;
  }
  return pPVar16;
}

Assistant:

static SQLITE_NOINLINE PgHdr1 *pcache1FetchStage2(
  PCache1 *pCache, 
  unsigned int iKey, 
  int createFlag
){
  unsigned int nPinned;
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *pPage = 0;

  /* Step 3: Abort if createFlag is 1 but the cache is nearly full */
  assert( pCache->nPage >= pCache->nRecyclable );
  nPinned = pCache->nPage - pCache->nRecyclable;
  assert( pGroup->mxPinned == pGroup->nMaxPage + 10 - pGroup->nMinPage );
  assert( pCache->n90pct == pCache->nMax*9/10 );
  if( createFlag==1 && (
        nPinned>=pGroup->mxPinned
     || nPinned>=pCache->n90pct
     || (pcache1UnderMemoryPressure(pCache) && pCache->nRecyclable<nPinned)
  )){
    return 0;
  }

  if( pCache->nPage>=pCache->nHash ) pcache1ResizeHash(pCache);
  assert( pCache->nHash>0 && pCache->apHash );

  /* Step 4. Try to recycle a page. */
  if( pCache->bPurgeable
   && !pGroup->lru.pLruPrev->isAnchor
   && ((pCache->nPage+1>=pCache->nMax) || pcache1UnderMemoryPressure(pCache))
  ){
    PCache1 *pOther;
    pPage = pGroup->lru.pLruPrev;
    assert( pPage->isPinned==0 );
    pcache1RemoveFromHash(pPage, 0);
    pcache1PinPage(pPage);
    pOther = pPage->pCache;
    if( pOther->szAlloc != pCache->szAlloc ){
      pcache1FreePage(pPage);
      pPage = 0;
    }else{
      pGroup->nCurrentPage -= (pOther->bPurgeable - pCache->bPurgeable);
    }
  }

  /* Step 5. If a usable page buffer has still not been found, 
  ** attempt to allocate a new one. 
  */
  if( !pPage ){
    pPage = pcache1AllocPage(pCache, createFlag==1);
  }

  if( pPage ){
    unsigned int h = iKey % pCache->nHash;
    pCache->nPage++;
    pPage->iKey = iKey;
    pPage->pNext = pCache->apHash[h];
    pPage->pCache = pCache;
    pPage->pLruPrev = 0;
    pPage->pLruNext = 0;
    pPage->isPinned = 1;
    *(void **)pPage->page.pExtra = 0;
    pCache->apHash[h] = pPage;
    if( iKey>pCache->iMaxKey ){
      pCache->iMaxKey = iKey;
    }
  }
  return pPage;
}